

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_tonumber(lua_State *L)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  lua_Integer lVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  byte *pbVar9;
  undefined8 unaff_R13;
  long lVar10;
  size_t l;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  
  iVar4 = lua_type(L,2);
  if (iVar4 < 1) {
    iVar4 = lua_type(L,1);
    if (iVar4 == 3) {
      lua_settop(L,1);
      return 1;
    }
    pcVar6 = lua_tolstring(L,1,&local_48);
    if ((pcVar6 != (char *)0x0) && (sVar8 = lua_stringtonumber(L,pcVar6), sVar8 == local_48 + 1)) {
      return 1;
    }
    luaL_checkany(L,1);
  }
  else {
    lVar5 = luaL_checkinteger(L,2);
    luaL_checktype(L,1,4);
    pcVar6 = lua_tolstring(L,1,&local_48);
    if (0x22 < lVar5 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar7 = strspn(pcVar6," \f\n\r\t\v");
    cVar2 = pcVar6[sVar7];
    pbVar9 = (byte *)(pcVar6 + ((cVar2 - 0x2bU & 0xfd) == 0) + sVar7);
    iVar4 = isalnum((uint)*pbVar9);
    if (iVar4 == 0) {
      pbVar9 = (byte *)0x0;
      lVar5 = 0;
    }
    else {
      lVar10 = 0;
      local_40 = pcVar6;
      local_38 = CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar2);
      do {
        bVar3 = *pbVar9;
        if (bVar3 - 0x30 < 10) {
          iVar4 = (char)bVar3 + -0x30;
        }
        else {
          iVar4 = toupper((uint)bVar3);
          iVar4 = iVar4 + -0x37;
        }
        if ((int)lVar5 <= iVar4) {
          pbVar9 = (byte *)0x0;
          lVar5 = 0;
          pcVar6 = local_40;
          goto LAB_00159556;
        }
        lVar10 = (long)iVar4 + lVar10 * (int)lVar5;
        pbVar1 = pbVar9 + 1;
        pbVar9 = pbVar9 + 1;
        iVar4 = isalnum((uint)*pbVar1);
      } while (iVar4 != 0);
      sVar7 = strspn((char *)pbVar9," \f\n\r\t\v");
      pbVar9 = pbVar9 + sVar7;
      lVar5 = -lVar10;
      pcVar6 = local_40;
      if ((char)local_38 != '-') {
        lVar5 = lVar10;
      }
    }
LAB_00159556:
    if (pbVar9 == (byte *)(pcVar6 + local_48)) {
      lua_pushinteger(L,lVar5);
      return 1;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
    if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
      lua_settop(L, 1);  /* yes; return it */
      return 1;
    }
    else {
      size_t l;
      const char *s = lua_tolstring(L, 1, &l);
      if (s != NULL && lua_stringtonumber(L, s) == l + 1)
        return 1;  /* successful conversion to number */
      /* else not a number */
      luaL_checkany(L, 1);  /* (but there must be some parameter) */
    }
  }
  else {
    size_t l;
    const char *s;
    lua_Integer n = 0;  /* to avoid warnings */
    lua_Integer base = luaL_checkinteger(L, 2);
    luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
    s = lua_tolstring(L, 1, &l);
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    if (b_str2int(s, (int)base, &n) == s + l) {
      lua_pushinteger(L, n);
      return 1;
    }  /* else not a number */
  }  /* else not a number */
  luaL_pushfail(L);  /* not a number */
  return 1;
}